

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * TEST_cargo_set_option_description(void)

{
  int iVar1;
  char *pcVar2;
  cargo_t cargo;
  int a;
  
  iVar1 = cargo_init(&cargo,0,"program");
  if (iVar1 == 0) {
    a = 0;
    iVar1 = cargo_add_option(cargo,0,"--alpha","an option","b");
    if (iVar1 == 0) {
      iVar1 = cargo_set_option_description(cargo,"--alpha","%s world %d","hello",0x7b);
      if (iVar1 == 0) {
        pcVar2 = (char *)0x0;
        cargo_print_usage(cargo,CARGO_USAGE_FULL);
      }
      else {
        pcVar2 = "Failed to set description";
      }
    }
    else {
      pcVar2 = "Failed to create option";
    }
    cargo_destroy(&cargo);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_cargo_set_option_description)
{
    int a = 0;
    ret = cargo_add_option(cargo, 0, "--alpha", "an option", "b", &a);
    cargo_assert(ret == 0, "Failed to create option");

    ret = cargo_set_option_description(cargo, "--alpha",
            "%s world %d", "hello", 123);
    cargo_assert(ret == 0, "Failed to set description");

    cargo_print_usage(cargo, 0);

    _TEST_CLEANUP();
}